

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_BinaryDilate(BinaryDilateForm2 BinaryDilate)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  EVP_PKEY_CTX *src;
  size_type __n;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  Image output;
  Image input;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ImageTemplate<unsigned_char> local_70;
  Image local_48;
  
  uVar3 = rand();
  __n = 0x14;
  if (0x14 < uVar3 % 200) {
    __n = (size_type)(uVar3 % 200);
  }
  local_48._vptr_ImageTemplate._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,__n,(value_type_conflict1 *)&local_48,(allocator_type *)&local_70);
  local_48._vptr_ImageTemplate = (_func_int **)((ulong)local_48._vptr_ImageTemplate._1_7_ << 8);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_48);
  }
  else {
    *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  Unit_Test::randomImage(&local_48,&local_88);
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  local_70._data = (uchar *)0x0;
  local_70._type = local_48._type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_70,(EVP_PKEY_CTX *)&local_48,src);
  Unit_Test::generateRoi(&local_70,&local_8c,&local_90,&local_94,&local_98);
  bVar1 = Unit_Test::verifyImage(&local_70,local_8c,local_90,local_94,local_98,'\0');
  bVar2 = true;
  if (bVar1) {
    uVar3 = rand();
    uVar4 = rand();
    (*BinaryDilate)(&local_70,local_8c,local_90,local_94,local_98,uVar3 % 5 + (uint)(uVar3 % 5 == 0)
                    ,uVar4 % 5 + (uint)(uVar4 % 5 == 0));
    bVar2 = Unit_Test::verifyImage(&local_70,local_8c,local_90,local_94,local_98,0xff);
  }
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form2_BinaryDilate(BinaryDilateForm2 BinaryDilate)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 255u );
        fillData.push_back(0u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( output, roiX, roiY, roiWidth, roiHeight );
        if ( !verifyImage(output, roiX, roiY, roiWidth, roiHeight, 0u) ) // full ROI is black, nothing to dilate
            return true;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);
        
        BinaryDilate( output, roiX, roiY, roiWidth, roiHeight, dilationX, dilationY );

        return verifyImage( output, roiX, roiY, roiWidth, roiHeight, 255u );
    }